

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall kj::Exception::Exception(Exception *this,Exception *other)

{
  ArrayDisposer *pAVar1;
  Context *pCVar2;
  Disposer *pDVar3;
  uchar *__src;
  size_t capacity;
  Detail *pDVar4;
  Type TVar5;
  Context *this_00;
  uchar *__dest;
  Detail *pDVar6;
  char *pcVar7;
  String *extraout_RDX;
  size_t size_00;
  String *params;
  uchar *puVar8;
  Detail *detail;
  Detail *pDVar9;
  char *pcVar10;
  size_t sVar11;
  String local_60;
  Vector<kj::Exception::Detail> *local_48;
  Detail *local_40;
  DetailTypeId local_38;
  char *size;
  
  (this->ownFile).content.ptr = (char *)0x0;
  (this->ownFile).content.size_ = 0;
  (this->ownFile).content.disposer = (ArrayDisposer *)0x0;
  this->file = other->file;
  TVar5 = other->type;
  this->line = other->line;
  this->type = TVar5;
  pcVar10 = (char *)(other->description).content.size_;
  pcVar7 = pcVar10;
  if (pcVar10 != (char *)0x0) {
    pcVar7 = (other->description).content.ptr;
  }
  size = pcVar10 + -1;
  if (pcVar10 == (char *)0x0) {
    size = (char *)0x0;
  }
  heapString(&this->description,pcVar7,(size_t)size);
  (this->remoteTrace).content.ptr = (char *)0x0;
  (this->remoteTrace).content.size_ = 0;
  (this->context).ptr.disposer = (Disposer *)0x0;
  (this->context).ptr.ptr = (Context *)0x0;
  (this->remoteTrace).content.disposer = (ArrayDisposer *)0x0;
  this->traceCount = other->traceCount;
  this->isFullTrace = false;
  (this->details).builder.ptr = (Detail *)0x0;
  (this->details).builder.pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  (this->details).builder.endPtr = (Detail *)0x0;
  (this->details).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  pcVar10 = (other->ownFile).content.ptr;
  sVar11 = (other->ownFile).content.size_;
  pcVar7 = pcVar10;
  if (sVar11 == 0) {
    pcVar7 = "";
  }
  params = extraout_RDX;
  if (this->file == pcVar7) {
    if (sVar11 == 0) {
      pcVar10 = (char *)0x0;
    }
    size_00 = 0;
    if (sVar11 != 0) {
      size_00 = sVar11 - 1;
    }
    heapString(&local_60,pcVar10,size_00);
    pcVar10 = (this->ownFile).content.ptr;
    if (pcVar10 != (char *)0x0) {
      sVar11 = (this->ownFile).content.size_;
      pAVar1 = (this->ownFile).content.disposer;
      (this->ownFile).content.ptr = (char *)0x0;
      (this->ownFile).content.size_ = 0;
      (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar10,1,sVar11,sVar11,0);
    }
    (this->ownFile).content.ptr = local_60.content.ptr;
    (this->ownFile).content.size_ = local_60.content.size_;
    (this->ownFile).content.disposer = local_60.content.disposer;
    pcVar10 = "";
    if (local_60.content.size_ != 0) {
      pcVar10 = local_60.content.ptr;
    }
    this->file = pcVar10;
    params = (String *)local_60.content.disposer;
  }
  if (1 < (other->remoteTrace).content.size_) {
    str<kj::String_const&>(&local_60,(kj *)&other->remoteTrace,params);
    pcVar10 = (this->remoteTrace).content.ptr;
    if (pcVar10 != (char *)0x0) {
      sVar11 = (this->remoteTrace).content.size_;
      (this->remoteTrace).content.ptr = (char *)0x0;
      (this->remoteTrace).content.size_ = 0;
      pAVar1 = (this->remoteTrace).content.disposer;
      (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar10,1,sVar11,sVar11,0);
    }
    (this->remoteTrace).content.ptr = local_60.content.ptr;
    (this->remoteTrace).content.size_ = local_60.content.size_;
    (this->remoteTrace).content.disposer = local_60.content.disposer;
  }
  memcpy(this->trace,other->trace,(ulong)this->traceCount << 3);
  pCVar2 = (other->context).ptr.ptr;
  if (pCVar2 != (Context *)0x0) {
    this_00 = (Context *)operator_new(0x38);
    Context::Context(this_00,pCVar2);
    pDVar3 = (this->context).ptr.disposer;
    pCVar2 = (this->context).ptr.ptr;
    (this->context).ptr.disposer = (Disposer *)&_::HeapDisposer<kj::Exception::Context>::instance;
    (this->context).ptr.ptr = this_00;
    if (pCVar2 != (Context *)0x0) {
      (**pDVar3->_vptr_Disposer)();
    }
  }
  pDVar9 = (other->details).builder.ptr;
  local_40 = (other->details).builder.pos;
  if (pDVar9 != local_40) {
    local_48 = &this->details;
    do {
      local_38 = pDVar9->id;
      __src = (pDVar9->value).ptr;
      capacity = (pDVar9->value).size_;
      __dest = (uchar *)_::HeapArrayDisposer::allocateImpl
                                  (1,0,capacity,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
      puVar8 = __dest;
      if (capacity != 0) {
        puVar8 = __dest + capacity;
        memcpy(__dest,__src,capacity);
      }
      pDVar6 = (this->details).builder.pos;
      if (pDVar6 == (this->details).builder.endPtr) {
        pDVar4 = (local_48->builder).ptr;
        sVar11 = (long)pDVar6 - (long)pDVar4 >> 4;
        if (pDVar6 == pDVar4) {
          sVar11 = 4;
        }
        Vector<kj::Exception::Detail>::setCapacity(local_48,sVar11);
        pDVar6 = (this->details).builder.pos;
      }
      pDVar6->id = local_38;
      (pDVar6->value).ptr = __dest;
      (pDVar6->value).size_ = (long)puVar8 - (long)__dest;
      (pDVar6->value).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      (this->details).builder.pos = pDVar6 + 1;
      pDVar9 = pDVar9 + 1;
    } while (pDVar9 != local_40);
  }
  return;
}

Assistant:

Exception::Exception(const Exception& other) noexcept
    : file(other.file), line(other.line), type(other.type),
      description(heapString(other.description)), traceCount(other.traceCount) {
  if (file == other.ownFile.cStr()) {
    ownFile = heapString(other.ownFile);
    file = ownFile.cStr();
  }

  if (other.remoteTrace != nullptr) {
    remoteTrace = kj::str(other.remoteTrace);
  }

  memcpy(trace, other.trace, sizeof(trace[0]) * traceCount);

  KJ_IF_SOME(c, other.context) {
    context = heap(*c);
  }

  for (auto& detail: other.details) {
    details.add(Detail {
      .id = detail.id,
      .value = kj::heapArray(detail.value.asPtr()),
    });
  }
}